

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcher.cpp
# Opt level: O0

void __thiscall Kernel::MLMatcher::Impl::Impl(Impl *this)

{
  long in_RDI;
  DArray<std::pair<int,_int>_> *this_00;
  size_t size;
  size_t in_stack_ffffffffffffff88;
  TriangularArray<std::pair<int,_int>_*> *in_stack_ffffffffffffff90;
  
  Lib::DArray<Kernel::Literal_*>::DArray
            ((DArray<Kernel::Literal_*> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::DArray
            ((DArray<const_Lib::List<Kernel::Literal_*>_*> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  Lib::DArray<unsigned_int>::DArray
            ((DArray<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::DArray<unsigned_int_*>::DArray
            ((DArray<unsigned_int_*> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::DArray<Kernel::TermList_**>::DArray
            ((DArray<Kernel::TermList_**> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::TriangularArray<unsigned_int>::TriangularArray
            ((TriangularArray<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::TriangularArray<std::pair<int,_int>_*>::TriangularArray
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Lib::DArray<unsigned_int>::DArray
            ((DArray<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = (DArray<std::pair<int,_int>_> *)(in_RDI + 0xc0);
  Lib::DArray<unsigned_int>::DArray((DArray<unsigned_int> *)this_00,in_stack_ffffffffffffff88);
  size = in_RDI + 0xd8;
  Lib::DArray<Kernel::TermList_*>::DArray((DArray<Kernel::TermList_*> *)this_00,size);
  Lib::DArray<Kernel::TermList>::DArray((DArray<Kernel::TermList> *)this_00,size);
  Lib::DArray<std::pair<int,_int>_>::DArray(this_00,size);
  Lib::DArray<unsigned_int>::DArray((DArray<unsigned_int> *)this_00,size);
  MLMatchStats::MLMatchStats((MLMatchStats *)(in_RDI + 0x1b8));
  return;
}

Assistant:

MLMatcher::Impl::Impl()
  : s_baseLits(32)
  , s_altsArr(32)
  , s_varCnts(32)
  , s_boundVarNums(32)
  , s_altPtrs(32)
  , s_remaining(32)
  , s_intersections(32)
  , s_nextAlts(32)
  , s_boundVarNumData(64)
  , s_altBindingPtrs(128)
  , s_altBindingsData(256)
  , s_intersectionData(128)
  , s_matchRecord(32)
{ }